

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint_casts.cpp
# Opt level: O3

string_t __thiscall duckdb::IntToVarInt<signed_char>(duckdb *this,Vector *result,char int_value)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  char cVar9;
  undefined7 in_register_00000011;
  idx_t len;
  idx_t extraout_RDX;
  ulong uVar10;
  byte bVar11;
  ulong uVar12;
  Vector *vector;
  undefined1 *puVar13;
  uint uVar14;
  char *blob_00;
  double dVar15;
  ulong uVar16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  long lVar38;
  int iVar41;
  undefined1 auVar39 [16];
  int iVar42;
  undefined1 auVar40 [16];
  int iVar43;
  int iVar54;
  int iVar55;
  int iVar56;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  int iVar67;
  undefined1 auVar66 [16];
  int iVar68;
  long lVar69;
  long lVar77;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  long lVar78;
  long lVar79;
  string_t sVar80;
  string_t blob;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  long local_48;
  long lStack_40;
  
  len = CONCAT71(in_register_00000011,int_value);
  cVar9 = (char)result;
  if (cVar9 < '\0') {
    uVar12 = -(long)cVar9;
  }
  else {
    if (cVar9 == '\0') {
      uVar14 = 1;
      uVar12 = 0;
      goto LAB_00fe3171;
    }
    uVar12 = (ulong)result & 0xff;
  }
  dVar15 = log2((double)((int)uVar12 + 1));
  dVar15 = ceil(dVar15 * 0.125);
  uVar14 = (uint)(long)dVar15;
  len = extraout_RDX;
LAB_00fe3171:
  vector = (Vector *)(ulong)(uVar14 + 3);
  local_68 = (undefined1  [16])StringVector::EmptyString((StringVector *)this,vector,len);
  blob_00 = local_68._8_8_;
  if (local_68._0_4_ < 0xd) {
    blob_00 = local_68 + 4;
  }
  Varint::SetHeader(blob_00,(ulong)uVar14,(bool)((byte)(((ulong)result & 0xffffffff) >> 7) & 1));
  if (0 < (int)uVar14) {
    uVar16 = (ulong)uVar14;
    lVar69 = uVar16 - 0xe;
    uVar10 = (ulong)uVar14;
    lVar77 = uVar10 - 0xf;
    lVar26 = uVar16 - 0xc;
    lVar27 = uVar10 - 0xd;
    lVar28 = uVar16 - 10;
    lVar29 = uVar10 - 0xb;
    lVar30 = uVar16 - 8;
    lVar31 = uVar10 - 9;
    lVar32 = uVar16 - 6;
    lVar33 = uVar10 - 7;
    lVar34 = uVar16 - 4;
    lVar35 = uVar10 - 5;
    lVar78 = uVar16 - 2;
    lVar79 = uVar10 - 3;
    lVar17 = uVar10 - 1;
    puVar13 = (undefined1 *)
              ((long)&vector[-1].auxiliary.internal.
                      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 4);
    local_58._8_4_ = (int)puVar13;
    local_58._0_8_ = puVar13;
    local_58._12_4_ = (int)((ulong)puVar13 >> 0x20);
    bVar11 = cVar9 >> 7;
    uVar10 = 0;
    do {
      auVar66._8_4_ = (int)uVar10;
      auVar66._0_8_ = uVar10;
      auVar66._12_4_ = (int)(uVar10 >> 0x20);
      auVar39 = local_58 ^ _DAT_01d99b10;
      auVar36 = (auVar66 | _DAT_01d99b00) ^ _DAT_01d99b10;
      iVar67 = auVar39._0_4_;
      iVar43 = -(uint)(iVar67 < auVar36._0_4_);
      iVar68 = auVar39._4_4_;
      iVar54 = -(uint)(iVar68 < auVar36._4_4_);
      iVar41 = auVar39._8_4_;
      iVar55 = -(uint)(iVar41 < auVar36._8_4_);
      iVar42 = auVar39._12_4_;
      iVar56 = -(uint)(iVar42 < auVar36._12_4_);
      auVar70._4_4_ = iVar43;
      auVar70._0_4_ = iVar43;
      auVar70._8_4_ = iVar55;
      auVar70._12_4_ = iVar55;
      auVar62 = pshuflw(in_XMM12,auVar70,0xe8);
      auVar44._4_4_ = -(uint)(auVar36._4_4_ == iVar68);
      auVar44._12_4_ = -(uint)(auVar36._12_4_ == iVar42);
      auVar44._0_4_ = auVar44._4_4_;
      auVar44._8_4_ = auVar44._12_4_;
      auVar57 = pshuflw(in_XMM10,auVar44,0xe8);
      auVar37._4_4_ = iVar54;
      auVar37._0_4_ = iVar54;
      auVar37._8_4_ = iVar56;
      auVar37._12_4_ = iVar56;
      auVar39 = pshuflw(_DAT_01d99b10,auVar37,0xe8);
      auVar36._8_4_ = 0xffffffff;
      auVar36._0_8_ = 0xffffffffffffffff;
      auVar36._12_4_ = 0xffffffff;
      auVar36 = (auVar39 | auVar57 & auVar62) ^ auVar36;
      auVar36 = packssdw(auVar36,auVar36);
      local_48 = lVar69;
      lStack_40 = lVar77;
      if ((auVar36 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        blob_00[uVar10 + 3] = (byte)(uVar12 >> (((char)uVar16 + -1) * '\b' & 0x3fU)) ^ bVar11;
      }
      auVar37 = auVar44 & auVar70 | auVar37;
      auVar36 = packssdw(auVar37,auVar37);
      auVar39._8_4_ = 0xffffffff;
      auVar39._0_8_ = 0xffffffffffffffff;
      auVar39._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36 ^ auVar39,auVar36 ^ auVar39);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36._0_4_ >> 8 & 1) != 0) {
        blob_00[uVar10 + 4] = (byte)(uVar12 >> ((byte)((int)(lVar17 + -1) << 3) & 0x3f)) ^ bVar11;
      }
      auVar36 = (auVar66 | _DAT_01d9abd0) ^ _DAT_01d99b10;
      iVar43 = -(uint)(iVar67 < auVar36._0_4_);
      iVar55 = -(uint)(iVar68 < auVar36._4_4_);
      iVar54 = -(uint)(iVar41 < auVar36._8_4_);
      iVar56 = -(uint)(iVar42 < auVar36._12_4_);
      auVar62._4_4_ = iVar43;
      auVar62._0_4_ = iVar43;
      auVar62._8_4_ = iVar54;
      auVar62._12_4_ = iVar54;
      iVar43 = -(uint)(auVar36._4_4_ == iVar68);
      iVar54 = -(uint)(auVar36._12_4_ == iVar42);
      auVar71._4_4_ = iVar43;
      auVar71._0_4_ = iVar43;
      auVar71._8_4_ = iVar54;
      auVar71._12_4_ = iVar54;
      auVar63._4_4_ = iVar55;
      auVar63._0_4_ = iVar55;
      auVar63._8_4_ = iVar56;
      auVar63._12_4_ = iVar56;
      auVar36 = auVar71 & auVar62 | auVar63;
      auVar36 = packssdw(auVar36,auVar36);
      auVar57._8_4_ = 0xffffffff;
      auVar57._0_8_ = 0xffffffffffffffff;
      auVar57._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36 ^ auVar57,auVar36 ^ auVar57);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36._0_4_ >> 0x10 & 1) != 0) {
        blob_00[uVar10 + 5] = (byte)(uVar12 >> (((char)lVar78 + -1) * '\b' & 0x3fU)) ^ bVar11;
      }
      auVar36 = pshufhw(auVar36,auVar62,0x84);
      auVar44 = pshufhw(auVar62,auVar71,0x84);
      auVar39 = pshufhw(auVar36,auVar63,0x84);
      auVar18._8_4_ = 0xffffffff;
      auVar18._0_8_ = 0xffffffffffffffff;
      auVar18._12_4_ = 0xffffffff;
      auVar18 = (auVar39 | auVar44 & auVar36) ^ auVar18;
      auVar36 = packssdw(auVar18,auVar18);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36._0_4_ >> 0x18 & 1) != 0) {
        blob_00[uVar10 + 6] = (byte)(uVar12 >> ((byte)((int)(lVar79 + -1) << 3) & 0x3f)) ^ bVar11;
      }
      auVar36 = (auVar66 | _DAT_01d9abc0) ^ _DAT_01d99b10;
      auVar58._0_4_ = -(uint)(iVar67 < auVar36._0_4_);
      auVar58._4_4_ = -(uint)(iVar68 < auVar36._4_4_);
      auVar58._8_4_ = -(uint)(iVar41 < auVar36._8_4_);
      auVar58._12_4_ = -(uint)(iVar42 < auVar36._12_4_);
      auVar72._4_4_ = auVar58._0_4_;
      auVar72._0_4_ = auVar58._0_4_;
      auVar72._8_4_ = auVar58._8_4_;
      auVar72._12_4_ = auVar58._8_4_;
      auVar44 = pshuflw(auVar63,auVar72,0xe8);
      auVar19._0_4_ = -(uint)(auVar36._0_4_ == iVar67);
      auVar19._4_4_ = -(uint)(auVar36._4_4_ == iVar68);
      auVar19._8_4_ = -(uint)(auVar36._8_4_ == iVar41);
      auVar19._12_4_ = -(uint)(auVar36._12_4_ == iVar42);
      auVar45._4_4_ = auVar19._4_4_;
      auVar45._0_4_ = auVar19._4_4_;
      auVar45._8_4_ = auVar19._12_4_;
      auVar45._12_4_ = auVar19._12_4_;
      auVar36 = pshuflw(auVar19,auVar45,0xe8);
      auVar46._4_4_ = auVar58._4_4_;
      auVar46._0_4_ = auVar58._4_4_;
      auVar46._8_4_ = auVar58._12_4_;
      auVar46._12_4_ = auVar58._12_4_;
      auVar39 = pshuflw(auVar58,auVar46,0xe8);
      auVar1._8_4_ = 0xffffffff;
      auVar1._0_8_ = 0xffffffffffffffff;
      auVar1._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36 & auVar44,(auVar39 | auVar36 & auVar44) ^ auVar1);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        blob_00[uVar10 + 7] = (byte)(uVar12 >> (((char)lVar34 + -1) * '\b' & 0x3fU)) ^ bVar11;
      }
      auVar46 = auVar45 & auVar72 | auVar46;
      auVar39 = packssdw(auVar46,auVar46);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36,auVar39 ^ auVar2);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36._4_2_ >> 8 & 1) != 0) {
        blob_00[uVar10 + 8] = (byte)(uVar12 >> ((byte)((int)(lVar35 + -1) << 3) & 0x3f)) ^ bVar11;
      }
      auVar36 = (auVar66 | _DAT_01d9abb0) ^ _DAT_01d99b10;
      iVar43 = -(uint)(iVar67 < auVar36._0_4_);
      iVar55 = -(uint)(iVar68 < auVar36._4_4_);
      iVar54 = -(uint)(iVar41 < auVar36._8_4_);
      iVar56 = -(uint)(iVar42 < auVar36._12_4_);
      auVar47._4_4_ = iVar43;
      auVar47._0_4_ = iVar43;
      auVar47._8_4_ = iVar54;
      auVar47._12_4_ = iVar54;
      iVar43 = -(uint)(auVar36._4_4_ == iVar68);
      iVar54 = -(uint)(auVar36._12_4_ == iVar42);
      auVar64._4_4_ = iVar43;
      auVar64._0_4_ = iVar43;
      auVar64._8_4_ = iVar54;
      auVar64._12_4_ = iVar54;
      auVar73._4_4_ = iVar55;
      auVar73._0_4_ = iVar55;
      auVar73._8_4_ = iVar56;
      auVar73._12_4_ = iVar56;
      auVar36 = auVar64 & auVar47 | auVar73;
      auVar36 = packssdw(auVar36,auVar36);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36 ^ auVar3,auVar36 ^ auVar3);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        blob_00[uVar10 + 9] = (byte)(uVar12 >> (((char)lVar32 + -1) * '\b' & 0x3fU)) ^ bVar11;
      }
      auVar36 = pshufhw(auVar36,auVar47,0x84);
      auVar44 = pshufhw(auVar47,auVar64,0x84);
      auVar39 = pshufhw(auVar36,auVar73,0x84);
      auVar20._8_4_ = 0xffffffff;
      auVar20._0_8_ = 0xffffffffffffffff;
      auVar20._12_4_ = 0xffffffff;
      auVar20 = (auVar39 | auVar44 & auVar36) ^ auVar20;
      auVar36 = packssdw(auVar20,auVar20);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36._6_2_ >> 8 & 1) != 0) {
        blob_00[uVar10 + 10] = (byte)(uVar12 >> ((byte)((int)(lVar33 + -1) << 3) & 0x3f)) ^ bVar11;
      }
      auVar36 = (auVar66 | _DAT_01d9aba0) ^ _DAT_01d99b10;
      auVar59._0_4_ = -(uint)(iVar67 < auVar36._0_4_);
      auVar59._4_4_ = -(uint)(iVar68 < auVar36._4_4_);
      auVar59._8_4_ = -(uint)(iVar41 < auVar36._8_4_);
      auVar59._12_4_ = -(uint)(iVar42 < auVar36._12_4_);
      auVar74._4_4_ = auVar59._0_4_;
      auVar74._0_4_ = auVar59._0_4_;
      auVar74._8_4_ = auVar59._8_4_;
      auVar74._12_4_ = auVar59._8_4_;
      auVar44 = pshuflw(auVar64,auVar74,0xe8);
      auVar21._0_4_ = -(uint)(auVar36._0_4_ == iVar67);
      auVar21._4_4_ = -(uint)(auVar36._4_4_ == iVar68);
      auVar21._8_4_ = -(uint)(auVar36._8_4_ == iVar41);
      auVar21._12_4_ = -(uint)(auVar36._12_4_ == iVar42);
      auVar48._4_4_ = auVar21._4_4_;
      auVar48._0_4_ = auVar21._4_4_;
      auVar48._8_4_ = auVar21._12_4_;
      auVar48._12_4_ = auVar21._12_4_;
      auVar36 = pshuflw(auVar21,auVar48,0xe8);
      auVar49._4_4_ = auVar59._4_4_;
      auVar49._0_4_ = auVar59._4_4_;
      auVar49._8_4_ = auVar59._12_4_;
      auVar49._12_4_ = auVar59._12_4_;
      auVar39 = pshuflw(auVar59,auVar49,0xe8);
      auVar60._8_4_ = 0xffffffff;
      auVar60._0_8_ = 0xffffffffffffffff;
      auVar60._12_4_ = 0xffffffff;
      auVar60 = (auVar39 | auVar36 & auVar44) ^ auVar60;
      auVar39 = packssdw(auVar60,auVar60);
      auVar36 = packsswb(auVar36 & auVar44,auVar39);
      if ((auVar36 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        blob_00[uVar10 + 0xb] = (byte)(uVar12 >> (((char)lVar30 + -1) * '\b' & 0x3fU)) ^ bVar11;
      }
      auVar49 = auVar48 & auVar74 | auVar49;
      auVar39 = packssdw(auVar49,auVar49);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar39 = packssdw(auVar39 ^ auVar4,auVar39 ^ auVar4);
      auVar36 = packsswb(auVar36,auVar39);
      if ((auVar36._8_2_ >> 8 & 1) != 0) {
        blob_00[uVar10 + 0xc] = (byte)(uVar12 >> ((byte)((int)(lVar31 + -1) << 3) & 0x3f)) ^ bVar11;
      }
      auVar36 = (auVar66 | _DAT_01d9ab90) ^ _DAT_01d99b10;
      iVar43 = -(uint)(iVar67 < auVar36._0_4_);
      iVar55 = -(uint)(iVar68 < auVar36._4_4_);
      iVar54 = -(uint)(iVar41 < auVar36._8_4_);
      iVar56 = -(uint)(iVar42 < auVar36._12_4_);
      auVar50._4_4_ = iVar43;
      auVar50._0_4_ = iVar43;
      auVar50._8_4_ = iVar54;
      auVar50._12_4_ = iVar54;
      iVar43 = -(uint)(auVar36._4_4_ == iVar68);
      iVar54 = -(uint)(auVar36._12_4_ == iVar42);
      auVar65._4_4_ = iVar43;
      auVar65._0_4_ = iVar43;
      auVar65._8_4_ = iVar54;
      auVar65._12_4_ = iVar54;
      auVar75._4_4_ = iVar55;
      auVar75._0_4_ = iVar55;
      auVar75._8_4_ = iVar56;
      auVar75._12_4_ = iVar56;
      auVar36 = auVar65 & auVar50 | auVar75;
      auVar36 = packssdw(auVar36,auVar36);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36 ^ auVar5,auVar36 ^ auVar5);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        blob_00[uVar10 + 0xd] = (byte)(uVar12 >> (((char)lVar28 + -1) * '\b' & 0x3fU)) ^ bVar11;
      }
      auVar36 = pshufhw(auVar36,auVar50,0x84);
      auVar44 = pshufhw(auVar50,auVar65,0x84);
      auVar39 = pshufhw(auVar36,auVar75,0x84);
      auVar22._8_4_ = 0xffffffff;
      auVar22._0_8_ = 0xffffffffffffffff;
      auVar22._12_4_ = 0xffffffff;
      auVar22 = (auVar39 | auVar44 & auVar36) ^ auVar22;
      auVar36 = packssdw(auVar22,auVar22);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36._10_2_ >> 8 & 1) != 0) {
        blob_00[uVar10 + 0xe] = (byte)(uVar12 >> ((byte)((int)(lVar29 + -1) << 3) & 0x3f)) ^ bVar11;
      }
      auVar36 = (auVar66 | _DAT_01d9ab80) ^ _DAT_01d99b10;
      auVar61._0_4_ = -(uint)(iVar67 < auVar36._0_4_);
      auVar61._4_4_ = -(uint)(iVar68 < auVar36._4_4_);
      auVar61._8_4_ = -(uint)(iVar41 < auVar36._8_4_);
      auVar61._12_4_ = -(uint)(iVar42 < auVar36._12_4_);
      auVar76._4_4_ = auVar61._0_4_;
      auVar76._0_4_ = auVar61._0_4_;
      auVar76._8_4_ = auVar61._8_4_;
      auVar76._12_4_ = auVar61._8_4_;
      auVar44 = pshuflw(auVar65,auVar76,0xe8);
      auVar23._0_4_ = -(uint)(auVar36._0_4_ == iVar67);
      auVar23._4_4_ = -(uint)(auVar36._4_4_ == iVar68);
      auVar23._8_4_ = -(uint)(auVar36._8_4_ == iVar41);
      auVar23._12_4_ = -(uint)(auVar36._12_4_ == iVar42);
      auVar51._4_4_ = auVar23._4_4_;
      auVar51._0_4_ = auVar23._4_4_;
      auVar51._8_4_ = auVar23._12_4_;
      auVar51._12_4_ = auVar23._12_4_;
      auVar36 = pshuflw(auVar23,auVar51,0xe8);
      auVar52._4_4_ = auVar61._4_4_;
      auVar52._0_4_ = auVar61._4_4_;
      auVar52._8_4_ = auVar61._12_4_;
      auVar52._12_4_ = auVar61._12_4_;
      auVar39 = pshuflw(auVar61,auVar52,0xe8);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36 & auVar44,(auVar39 | auVar36 & auVar44) ^ auVar6);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        blob_00[uVar10 + 0xf] = (byte)(uVar12 >> (((char)lVar26 + -1) * '\b' & 0x3fU)) ^ bVar11;
      }
      auVar52 = auVar51 & auVar76 | auVar52;
      auVar39 = packssdw(auVar52,auVar52);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36,auVar39 ^ auVar7);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36._12_2_ >> 8 & 1) != 0) {
        blob_00[uVar10 + 0x10] = (byte)(uVar12 >> ((byte)((int)(lVar27 + -1) << 3) & 0x3f)) ^ bVar11
        ;
      }
      lVar77 = lStack_40;
      lVar69 = local_48;
      lVar38 = lStack_40 + -1;
      auVar36 = (auVar66 | _DAT_01d9ab70) ^ _DAT_01d99b10;
      auVar24._0_4_ = -(uint)(iVar67 < auVar36._0_4_);
      auVar24._4_4_ = -(uint)(iVar68 < auVar36._4_4_);
      auVar24._8_4_ = -(uint)(iVar41 < auVar36._8_4_);
      auVar24._12_4_ = -(uint)(iVar42 < auVar36._12_4_);
      auVar53._4_4_ = auVar24._0_4_;
      auVar53._0_4_ = auVar24._0_4_;
      auVar53._8_4_ = auVar24._8_4_;
      auVar53._12_4_ = auVar24._8_4_;
      iVar67 = -(uint)(auVar36._4_4_ == iVar68);
      iVar68 = -(uint)(auVar36._12_4_ == iVar42);
      auVar40._4_4_ = iVar67;
      auVar40._0_4_ = iVar67;
      auVar40._8_4_ = iVar68;
      auVar40._12_4_ = iVar68;
      in_XMM12._4_4_ = auVar24._4_4_;
      in_XMM12._0_4_ = auVar24._4_4_;
      in_XMM12._8_4_ = auVar24._12_4_;
      in_XMM12._12_4_ = auVar24._12_4_;
      in_XMM10 = auVar40 & auVar53 | in_XMM12;
      auVar36 = packssdw(auVar24,in_XMM10);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36 ^ auVar8,auVar36 ^ auVar8);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        blob_00[uVar10 + 0x11] = (byte)(uVar12 >> (((char)local_48 + -1) * '\b' & 0x3fU)) ^ bVar11;
      }
      auVar36 = pshufhw(auVar36,auVar53,0x84);
      auVar44 = pshufhw(auVar40,auVar40,0x84);
      auVar39 = pshufhw(auVar36,in_XMM12,0x84);
      auVar25._8_4_ = 0xffffffff;
      auVar25._0_8_ = 0xffffffffffffffff;
      auVar25._12_4_ = 0xffffffff;
      auVar25 = (auVar39 | auVar44 & auVar36) ^ auVar25;
      auVar36 = packssdw(auVar25,auVar25);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36._14_2_ >> 8 & 1) != 0) {
        blob_00[uVar10 + 0x12] = (byte)(uVar12 >> ((byte)((int)lVar38 << 3) & 0x3f)) ^ bVar11;
      }
      uVar10 = uVar10 + 0x10;
      uVar16 = uVar16 - 0x10;
      lVar17 = lVar17 + -0x10;
      lVar78 = lVar78 + -0x10;
      lVar79 = lVar79 + -0x10;
      lVar34 = lVar34 + -0x10;
      lVar35 = lVar35 + -0x10;
      lVar32 = lVar32 + -0x10;
      lVar33 = lVar33 + -0x10;
      lVar30 = lVar30 + -0x10;
      lVar31 = lVar31 + -0x10;
      lVar28 = lVar28 + -0x10;
      lVar29 = lVar29 + -0x10;
      lVar26 = lVar26 + -0x10;
      lVar27 = lVar27 + -0x10;
      lVar69 = lVar69 + -0x10;
      lVar77 = lVar77 + -0x10;
    } while (((ulong)&(vector->type).field_0x4 & 0xfffffffffffffff0) != uVar10);
  }
  uVar12 = (ulong)(uint)local_68._0_4_;
  if (uVar12 < 0xd) {
    switchD_012e3010::default(local_68 + uVar12 + 4,0,0xc - uVar12);
  }
  else {
    local_68._4_4_ = *(undefined4 *)local_68._8_8_;
  }
  sVar80.value.pointer.ptr = (char *)local_68._8_8_;
  sVar80.value._0_8_ = local_68._0_8_;
  return (string_t)sVar80.value;
}

Assistant:

string_t IntToVarInt(Vector &result, T int_value) {
	// Determine if the number is negative
	bool is_negative = int_value < 0;
	// Determine the number of data bytes
	uint64_t abs_value;
	if (is_negative) {
		if (int_value == std::numeric_limits<T>::min()) {
			abs_value = static_cast<uint64_t>(std::numeric_limits<T>::max()) + 1;
		} else {
			abs_value = static_cast<uint64_t>(std::abs(static_cast<int64_t>(int_value)));
		}
	} else {
		abs_value = static_cast<uint64_t>(int_value);
	}
	uint32_t data_byte_size;
	if (abs_value != NumericLimits<uint64_t>::Maximum()) {
		data_byte_size = (abs_value == 0) ? 1 : static_cast<uint32_t>(std::ceil(std::log2(abs_value + 1) / 8.0));
	} else {
		data_byte_size = static_cast<uint32_t>(std::ceil(std::log2(abs_value) / 8.0));
	}

	uint32_t blob_size = data_byte_size + Varint::VARINT_HEADER_SIZE;
	auto blob = StringVector::EmptyString(result, blob_size);
	auto writable_blob = blob.GetDataWriteable();
	Varint::SetHeader(writable_blob, data_byte_size, is_negative);

	// Add data bytes to the blob, starting off after header bytes
	idx_t wb_idx = Varint::VARINT_HEADER_SIZE;
	for (int i = static_cast<int>(data_byte_size) - 1; i >= 0; --i) {
		if (is_negative) {
			writable_blob[wb_idx++] = static_cast<char>(~(abs_value >> i * 8 & 0xFF));
		} else {
			writable_blob[wb_idx++] = static_cast<char>(abs_value >> i * 8 & 0xFF);
		}
	}
	blob.Finalize();
	return blob;
}